

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_random.c
# Opt level: O0

void arc4_addrandom(u_char *dat,int datlen)

{
  uint8_t uVar1;
  int local_18;
  uint8_t si;
  int n;
  int datlen_local;
  u_char *dat_local;
  
  rs.i = rs.i + 0xff;
  for (local_18 = 0; local_18 < 0x100; local_18 = local_18 + 1) {
    rs.i = rs.i + 1;
    uVar1 = rs.s[rs.i];
    rs.j = rs.j + uVar1 + dat[local_18 % datlen];
    rs.s[rs.i] = rs.s[rs.j];
    rs.s[rs.j] = uVar1;
  }
  rs.j = rs.i;
  return;
}

Assistant:

static inline void
arc4_addrandom(u_char *dat, int datlen)
{
	int     n;
	uint8_t si;

	rs.i--;
	for (n = 0; n < 256; n++) {
		rs.i = (rs.i + 1);
		si = rs.s[rs.i];
		rs.j = (rs.j + si + dat[n % datlen]);
		rs.s[rs.i] = rs.s[rs.j];
		rs.s[rs.j] = si;
	}
	rs.j = rs.i;
}